

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

int __thiscall helics::ConnectorFederateManager::getTranslatorCount(ConnectorFederateManager *this)

{
  shared_mutex *__rwlock;
  int iVar1;
  
  if ((this->translators).enabled == false) {
    iVar1 = (int)(this->translators).m_obj.dataStorage.csize;
  }
  else {
    __rwlock = &(this->translators).m_mutex;
    std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
    iVar1 = (int)(this->translators).m_obj.dataStorage.csize;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  return iVar1;
}

Assistant:

int ConnectorFederateManager::getTranslatorCount() const
{
    return static_cast<int>(translators.lock_shared()->size());
}